

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O1

int32 gauden_dist(gauden_t *g,int mgau,int32 n_top,mfcc_t **obs,gauden_dist_t **out_dist)

{
  uint uVar1;
  uint uVar2;
  gauden_dist_t *pgVar3;
  mfcc_t *pmVar4;
  mfcc_t **ppmVar5;
  mfcc_t **ppmVar6;
  mfcc_t *pmVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  mfcc_t mVar14;
  float fVar15;
  
  if ((n_top < 1) || (g->n_density < n_top)) {
    __assert_fail("(n_top > 0) && (n_top <= g->n_density)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x1f1,"int32 gauden_dist(gauden_t *, int, int32, mfcc_t **, gauden_dist_t **)");
  }
  if (0 < g->n_feat) {
    uVar10 = (ulong)(uint)n_top;
    uVar11 = n_top - 1;
    lVar13 = 0;
    do {
      pgVar3 = out_dist[lVar13];
      pmVar4 = obs[lVar13];
      uVar1 = g->featlen[lVar13];
      ppmVar5 = g->mean[mgau][lVar13];
      ppmVar6 = g->var[mgau][lVar13];
      pmVar7 = g->det[mgau][lVar13];
      uVar2 = g->n_density;
      if (n_top < (int)uVar2) {
        uVar8 = 0;
        do {
          pgVar3[uVar8].dist = -2.1474836e+09;
          uVar8 = uVar8 + 1;
        } while (uVar10 != uVar8);
        if (0 < (int)uVar2) {
          uVar8 = 0;
          do {
            mVar14 = pmVar7[uVar8];
            if (0 < (int)uVar1) {
              uVar12 = 0;
              do {
                if ((float)mVar14 < (float)pgVar3[uVar11].dist) goto LAB_0014b6b6;
                fVar15 = (float)pmVar4[uVar12] - (float)ppmVar5[uVar8][uVar12];
                mVar14 = (mfcc_t)((float)mVar14 - fVar15 * fVar15 * (float)ppmVar6[uVar8][uVar12]);
                uVar12 = uVar12 + 1;
              } while (uVar1 != uVar12);
            }
            if ((float)pgVar3[uVar11].dist <= (float)mVar14) {
              uVar12 = 0;
              while ((float)mVar14 < (float)pgVar3[uVar12].dist) {
                uVar12 = uVar12 + 1;
                if (uVar10 == uVar12) {
                  __assert_fail("i < n_top",
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                                ,0x1db,
                                "int32 compute_dist(gauden_dist_t *, int32, mfcc_t *, int32, mfcc_t **, mfcc_t **, mfcc_t *, int32)"
                               );
                }
              }
              lVar9 = uVar10 - 1;
              if ((int)uVar12 < (int)uVar11) {
                do {
                  pgVar3[lVar9] = pgVar3[lVar9 + -1];
                  lVar9 = lVar9 + -1;
                } while ((long)uVar12 < lVar9);
              }
              pgVar3[uVar12].dist = mVar14;
              pgVar3[uVar12].id = (int32)uVar8;
            }
LAB_0014b6b6:
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar2);
        }
      }
      else if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          mVar14 = pmVar7[uVar8];
          if (0 < (int)uVar1) {
            uVar12 = 0;
            do {
              fVar15 = (float)pmVar4[uVar12] - (float)ppmVar5[uVar8][uVar12];
              mVar14 = (mfcc_t)((float)mVar14 - fVar15 * fVar15 * (float)ppmVar6[uVar8][uVar12]);
              uVar12 = uVar12 + 1;
            } while (uVar1 != uVar12);
          }
          pgVar3[uVar8].dist = mVar14;
          pgVar3[uVar8].id = (int32)uVar8;
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar2);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < g->n_feat);
  }
  return 0;
}

Assistant:

int32
gauden_dist(gauden_t * g,
            int mgau, int32 n_top, mfcc_t** obs, gauden_dist_t ** out_dist)
{
    int32 f;

    assert((n_top > 0) && (n_top <= g->n_density));

    for (f = 0; f < g->n_feat; f++) {
        compute_dist(out_dist[f], n_top,
                     obs[f], g->featlen[f],
                     g->mean[mgau][f], g->var[mgau][f], g->det[mgau][f],
                     g->n_density);
        E_DEBUG("Top CW(%d,%d) = %d %d\n", mgau, f, out_dist[f][0].id,
                (int)out_dist[f][0].dist >> SENSCR_SHIFT);
    }

    return 0;
}